

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvlist.c
# Opt level: O0

void * nvlist_pack(nvlist_t *nvl,size_t *sizep)

{
  int iVar1;
  int *piVar2;
  size_t sVar3;
  size_t *sizep_local;
  nvlist_t *nvl_local;
  
  if (nvl == (nvlist_t *)0x0) {
    __assert_fail("(nvl) != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvlist.c"
                  ,0x3ef,"void *nvlist_pack(const nvlist_t *, size_t *)");
  }
  if (nvl->nvl_magic == 0x6e766c) {
    if (nvl->nvl_error == 0) {
      sVar3 = nvlist_ndescriptors(nvl);
      if (sVar3 == 0) {
        nvl_local = (nvlist_t *)nvlist_xpack(nvl,(int64_t *)0x0,sizep);
      }
      else {
        piVar2 = __errno_location();
        *piVar2 = 0x5f;
        nvl_local = (nvlist_t *)0x0;
      }
    }
    else {
      iVar1 = nvl->nvl_error;
      piVar2 = __errno_location();
      *piVar2 = iVar1;
      nvl_local = (nvlist_t *)0x0;
    }
    return nvl_local;
  }
  __assert_fail("(nvl)->nvl_magic == 0x6e766c",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvlist.c"
                ,0x3ef,"void *nvlist_pack(const nvlist_t *, size_t *)");
}

Assistant:

void *
nvlist_pack(const nvlist_t *nvl, size_t *sizep)
{

	NVLIST_ASSERT(nvl);

	if (nvl->nvl_error != 0) {
		ERRNO_SET(nvl->nvl_error);
		return (NULL);
	}

	if (nvlist_ndescriptors(nvl) > 0) {
		ERRNO_SET(EOPNOTSUPP);
		return (NULL);
	}

	return (nvlist_xpack(nvl, NULL, sizep));
}